

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O2

string * __thiscall
helics::TimeCoordinator::printTimeStatus_abi_cxx11_
          (string *__return_storage_ptr__,TimeCoordinator *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar8;
  string_view fmt;
  format_args args;
  double local_b8 [2];
  double local_a8;
  double local_98;
  double local_88;
  double local_78;
  double local_68;
  double local_58;
  double local_48;
  
  lVar1 = (this->time_granted).internalTimeCode;
  lVar2 = (this->time_requested).internalTimeCode;
  lVar3 = (this->time_exec).internalTimeCode;
  lVar4 = (this->time_allow).internalTimeCode;
  lVar5 = (this->time_value).internalTimeCode;
  lVar6 = (this->time_message).internalTimeCode;
  lVar7 = (this->time_minDe).internalTimeCode;
  aVar8.values_ = (value<fmt::v11::context> *)(lVar7 % 1000000000);
  local_b8[0] = (double)(lVar1 % 1000000000) * 1e-09 + (double)(lVar1 / 1000000000);
  lVar1 = (this->time_minminDe).internalTimeCode;
  local_a8 = (double)(lVar2 % 1000000000) * 1e-09 + (double)(lVar2 / 1000000000);
  local_98 = (double)(lVar3 % 1000000000) * 1e-09 + (double)(lVar3 / 1000000000);
  local_88 = (double)(lVar4 % 1000000000) * 1e-09 + (double)(lVar4 / 1000000000);
  local_78 = (double)(lVar5 % 1000000000) * 1e-09 + (double)(lVar5 / 1000000000);
  local_68 = (double)(lVar6 % 1000000000) * 1e-09 + (double)(lVar6 / 1000000000);
  local_58 = (double)(long)aVar8.values_ * 1e-09 + (double)(lVar7 / 1000000000);
  local_48 = (double)(lVar1 % 1000000000) * 1e-09 + (double)(lVar1 / 1000000000);
  fmt.size_ = 0xaaaaaaaa;
  fmt.data_ = (char *)0x75;
  args.field_1.values_ = aVar8.values_;
  args.desc_ = (unsigned_long_long)local_b8;
  ::fmt::v11::vformat_abi_cxx11_
            (__return_storage_ptr__,
             (v11 *)
             "{{\"granted_time\":{},\"requested_time\":{}, \"exec\":{}, \"allow\":{}, \"value\":{}, \"message\":{}, \"minDe\":{}, \"minminDe\":{}}}"
             ,fmt,args);
  return __return_storage_ptr__;
}

Assistant:

std::string TimeCoordinator::printTimeStatus() const
{
    return fmt::format(
        R"raw({{"granted_time":{},"requested_time":{}, "exec":{}, "allow":{}, "value":{}, "message":{}, "minDe":{}, "minminDe":{}}})raw",
        static_cast<double>(time_granted),
        static_cast<double>(time_requested),
        static_cast<double>(time_exec),
        static_cast<double>(time_allow),
        static_cast<double>(time_value),
        static_cast<double>(time_message),
        static_cast<double>(time_minDe),
        static_cast<double>(time_minminDe));
}